

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O0

int __thiscall gl4cts::TextureBarrierTests::init(TextureBarrierTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TextureBarrierTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x110);
  TextureBarrierDisjointTexels::TextureBarrierDisjointTexels
            ((TextureBarrierDisjointTexels *)pTVar1,(this->super_TestCaseGroup).m_context,
             this->m_api,"disjoint-texels");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x110);
  TextureBarrierOverlappingTexels::TextureBarrierOverlappingTexels
            ((TextureBarrierOverlappingTexels *)pTVar1,(this->super_TestCaseGroup).m_context,
             this->m_api,"overlapping-texels");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x100);
  TextureBarrierSameTexelRW::TextureBarrierSameTexelRW
            ((TextureBarrierSameTexelRW *)pTVar1,(this->super_TestCaseGroup).m_context,this->m_api,
             "same-texel-rw");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x100);
  TextureBarrierSameTexelRWMultipass::TextureBarrierSameTexelRWMultipass
            ((TextureBarrierSameTexelRWMultipass *)pTVar1,(this->super_TestCaseGroup).m_context,
             this->m_api,"same-texel-rw-multipass");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TextureBarrierTests::init(void)
{
	addChild(new TextureBarrierDisjointTexels(m_context, m_api, "disjoint-texels"));
	addChild(new TextureBarrierOverlappingTexels(m_context, m_api, "overlapping-texels"));
	addChild(new TextureBarrierSameTexelRW(m_context, m_api, "same-texel-rw"));
	addChild(new TextureBarrierSameTexelRWMultipass(m_context, m_api, "same-texel-rw-multipass"));
}